

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O1

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QString,_QVariant> *c)

{
  char *pcVar1;
  QTextStream *pQVar2;
  Entry *pEVar3;
  _func_int **pp_Var4;
  QString *pQVar5;
  QHash<QString,_QVariant> *pQVar6;
  ulong uVar7;
  storage_type *psVar8;
  Data *pDVar9;
  QString *this_00;
  char16_t *begin;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebugStateSaver local_58;
  QString local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  pQVar6 = c;
  QDebugStateSaver::QDebugStateSaver(&local_58,(QDebug *)debug.stream);
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  *(undefined1 *)&pQVar2[3]._vptr_QTextStream = 0;
  if (which == (char *)0x0) {
    this_00 = (QString *)0x0;
  }
  else {
    pQVar5 = (QString *)0xffffffffffffffff;
    do {
      this_00 = (QString *)((long)&(pQVar5->d).d + 1);
      pcVar1 = which + 1 + (long)pQVar5;
      pQVar5 = this_00;
    } while (*pcVar1 != '\0');
  }
  ba.m_data = (storage_type *)pQVar6;
  ba.m_size = (qsizetype)which;
  QString::fromUtf8(&local_50,this_00,ba);
  ::QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  ba_00.m_data = (storage_type *)pQVar6;
  ba_00.m_size = (qsizetype)"(";
  QString::fromUtf8(&local_50,(QString *)0x1,ba_00);
  ::QTextStream::operator<<(pQVar2,&local_50);
  if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
  if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
    ::QTextStream::operator<<(pQVar2,' ');
  }
  pDVar9 = c->d;
  if (pDVar9 == (Data *)0x0) {
    pDVar9 = (Data *)0x0;
  }
  else if (pDVar9->spans->offsets[0] == 0xff) {
    uVar7 = 1;
    do {
      uVar10 = uVar7;
      if (pDVar9->numBuckets == uVar10) goto LAB_002aed3d;
      uVar7 = uVar10 + 1;
    } while (pDVar9->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
    goto LAB_002aed3f;
  }
  uVar10 = 0;
LAB_002aed3f:
  do {
    if (uVar10 == 0 && pDVar9 == (Data *)0x0) {
      ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,')');
      pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
      if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
        ::QTextStream::operator<<(pQVar2,' ');
      }
      pp_Var4 = ((debug.stream)->ts)._vptr_QTextStream;
      ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
      *(_func_int ***)this = pp_Var4;
      QDebugStateSaver::~QDebugStateSaver(&local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QDebug)(Stream *)this;
    }
    ::QTextStream::operator<<((QTextStream *)((debug.stream)->ts)._vptr_QTextStream,'(');
    pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar2,' ');
    }
    pEVar3 = pDVar9->spans[uVar10 >> 7].entries;
    uVar7 = (ulong)pDVar9->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f];
    psVar8 = (storage_type *)(uVar7 * 0x38);
    begin = *(char16_t **)(pEVar3[uVar7].storage.data + 8);
    if ((QChar *)begin == (QChar *)0x0) {
      begin = L"";
    }
    QDebug::putString((QDebug *)debug.stream,(QChar *)begin,
                      *(size_t *)(pEVar3[uVar7].storage.data + 0x10));
    pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar2,' ');
    }
    pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    ba_01.m_data = psVar8;
    ba_01.m_size = (qsizetype)", ";
    QString::fromUtf8(&local_50,(QString *)0x2,ba_01);
    ::QTextStream::operator<<(pQVar2,&local_50);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar2 = (QTextStream *)((debug.stream)->ts)._vptr_QTextStream;
    if (*(char *)&pQVar2[3]._vptr_QTextStream == '\x01') {
      ::QTextStream::operator<<(pQVar2,' ');
    }
    ::operator<<(&local_60,(QVariant *)debug.stream);
    ::QTextStream::operator<<(&(local_60.stream)->ts,')');
    if ((local_60.stream)->space == true) {
      ::QTextStream::operator<<(&(local_60.stream)->ts,' ');
    }
    QDebug::~QDebug(&local_60);
    do {
      if (pDVar9->numBuckets - 1 == uVar10) goto LAB_002aed3d;
      uVar10 = uVar10 + 1;
    } while (pDVar9->spans[uVar10 >> 7].offsets[(uint)uVar10 & 0x7f] == 0xff);
  } while( true );
LAB_002aed3d:
  uVar10 = 0;
  pDVar9 = (Data *)0x0;
  goto LAB_002aed3f;
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}